

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wwf.cpp
# Opt level: O1

void calc_adj(void)

{
  int *piVar1;
  int *piVar2;
  bool bVar3;
  int ***pppiVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  
  pppiVar4 = adj;
  if (0 < bsize) {
    lVar7 = 1;
    do {
      if (0 < bsize) {
        piVar1 = pppiVar4[1][lVar7];
        piVar2 = (*pppiVar4)[lVar7];
        lVar8 = 0;
        do {
          piVar1[lVar8 + 1] = 0;
          piVar2[lVar8 + 1] = 0;
          lVar8 = lVar8 + 1;
        } while (lVar8 < bsize);
      }
      bVar3 = lVar7 < bsize;
      lVar7 = lVar7 + 1;
    } while (bVar3);
  }
  if (0 < bsize) {
    lVar7 = 1;
    do {
      if (0 < bsize) {
        lVar10 = 0;
        lVar8 = 1;
        do {
          if (board[lVar7][lVar8] == '\0') {
            lVar6 = -1;
            iVar9 = 0;
            do {
              lVar11 = 0;
              do {
                if ((((int)lVar11 + iVar9 & 1U) != 0) &&
                   ('\x01' < board[lVar6 + lVar7][lVar11 + lVar10])) {
                  iVar5 = score_word((int)lVar7,(int)lVar8,lVar11 != 1,true,true);
                  adj[lVar6 * lVar6][lVar7][lVar8] = iVar5;
                }
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              lVar6 = lVar6 + 1;
              iVar9 = iVar9 + 1;
            } while (lVar6 != 2);
          }
          lVar10 = lVar10 + 1;
          bVar3 = lVar8 < bsize;
          lVar8 = lVar8 + 1;
        } while (bVar3);
      }
      bVar3 = lVar7 < bsize;
      lVar7 = lVar7 + 1;
    } while (bVar3);
  }
  return;
}

Assistant:

void calc_adj() {
    for (int i = 1; i <= bsize; i++)
        for (int j = 1; j <= bsize; j++)
            adj[0][i][j] = adj[1][i][j] = 0;
    for (int i = 1; i <= bsize; i++) {
        for (int j = 1; j <= bsize; j++) {
            if (board[i][j] == 0) {
                for (int ii = -1; ii <= 1; ii++) {
                    for (int jj = -1; jj <= 1; jj++) {
                        if ((ii + jj) % 2 && board[i + ii][j + jj] > 1) {
                            //board[i][j]='A'+26; // dummy character to discount ij
                            adj[ii * ii][i][j] = score_word(i, j, jj != 0, true, true);
                            //board[i][j]=0;
                        }
                    }
                }
            }
        }
    }
}